

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# greg.c
# Opt level: O0

int yy_space(GREG *G)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int yythunkpos10;
  int yypos10;
  int yythunkpos0;
  int yypos0;
  GREG *G_local;
  
  iVar1 = G->pos;
  iVar2 = G->thunkpos;
  iVar5 = G->pos;
  iVar3 = G->thunkpos;
  iVar4 = yymatchChar(G,0x20);
  if (iVar4 == 0) {
    G->pos = iVar5;
    G->thunkpos = iVar3;
    iVar4 = yymatchChar(G,9);
    if (iVar4 == 0) {
      G->pos = iVar5;
      G->thunkpos = iVar3;
      iVar5 = yy_end_of_line(G);
      if (iVar5 == 0) {
        G->pos = iVar1;
        G->thunkpos = iVar2;
        return 0;
      }
    }
  }
  return 1;
}

Assistant:

YY_RULE(int) yy_space(GREG *G)
{  int yypos0= G->pos, yythunkpos0= G->thunkpos;  yyprintfv((stderr, "%s\n", "space"));

  {  int yypos10= G->pos, yythunkpos10= G->thunkpos;  if (!yymatchChar(G, ' ')) goto l11;
  goto l10;
  l11:;	  G->pos= yypos10; G->thunkpos= yythunkpos10;  if (!yymatchChar(G, '\t')) goto l12;
  goto l10;
  l12:;	  G->pos= yypos10; G->thunkpos= yythunkpos10;  if (!yy_end_of_line(G))  goto l9;

  }
  l10:;	  yyprintf((stderr, "  ok   space"));
  yyprintfGcontext;
  yyprintf((stderr, "\n"));

  return 1;
  l9:;	  G->pos= yypos0; G->thunkpos= yythunkpos0;  yyprintfv((stderr, "  fail %s", "space"));
  yyprintfvGcontext;
  yyprintfv((stderr, "\n"));

  return 0;
}